

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_EnergyReport_Test::TestBody(InterpreterTestSuite_PC_EnergyReport_Test *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  element_type *this_01;
  MockSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> *this_02;
  TypedExpectation<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
  *this_03;
  char *message;
  char *in_R9;
  string local_320;
  AssertHelper local_300;
  Message local_2f8;
  bool local_2e9;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_;
  allocator local_289;
  string local_288;
  Expression local_268;
  undefined1 local_250 [8];
  Value value;
  Expression expr;
  Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> local_1e0;
  WithoutMatchers local_1b9;
  Matcher<const_ot::commissioner::Address_&> local_1b8;
  MockSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> local_1a0;
  undefined1 local_180 [8];
  EnergyReport rep;
  undefined1 local_140 [8];
  TestContext ctx;
  InterpreterTestSuite_PC_EnergyReport_Test *this_local;
  
  ctx.mCommissionerAppStaticExpecter.gmock02_Create_150.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  InterpreterTestSuite::TestContext::TestContext((TestContext *)local_140);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,(TestContext *)local_140);
  ot::commissioner::EnergyReport::EnergyReport((EnergyReport *)local_180);
  this_01 = std::__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&ctx.mRegistry);
  testing::internal::AnythingMatcher::operator_cast_to_Matcher
            (&local_1b8,(AnythingMatcher *)&testing::_);
  CommissionerAppMock::gmock_GetEnergyReport(&local_1a0,this_01,&local_1b8);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::
            MockSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::
            operator()(&local_1a0,&local_1b9,(void *)0x0);
  this_03 = testing::internal::
            MockSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::
            InternalExpectedAt(this_02,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                               ,0x86a,"*ctx.mDefaultCommissionerObject","GetEnergyReport(_)");
  testing::Return<ot::commissioner::EnergyReport*>
            ((testing *)
             &expr.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(EnergyReport *)local_180);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_1e0,
             (ReturnAction *)
             &expr.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::
  TypedExpectation<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::
  WillOnce(this_03,&local_1e0);
  testing::Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::
  ~Action(&local_1e0);
  testing::internal::ReturnAction<ot::commissioner::EnergyReport_*>::~ReturnAction
            ((ReturnAction<ot::commissioner::EnergyReport_*> *)
             &expr.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::
  MockSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::~MockSpec
            (&local_1a0);
  testing::Matcher<const_ot::commissioner::Address_&>::~Matcher(&local_1b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8));
  ot::commissioner::Interpreter::Value::Value((Value *)local_250);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_288,"energy report 1234::5678",&local_289);
  ot::commissioner::Interpreter::ParseExpression(&local_268,(Interpreter *)local_140,&local_288);
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(this_00,&local_268);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  ot::commissioner::Interpreter::Eval((Value *)&gtest_ar_.message_,(Interpreter *)local_140,this_00)
  ;
  ot::commissioner::Interpreter::Value::operator=((Value *)local_250,(Value *)&gtest_ar_.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_.message_);
  local_2e9 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_250);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2e8,&local_2e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_320,(internal *)local_2e8,(AssertionResult *)0x46a487,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x871,message);
    testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    std::__cxx11::string::~string((string *)&local_320);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  ot::commissioner::Interpreter::Value::~Value((Value *)local_250);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&value.mData.field_2 + 8));
  ot::commissioner::EnergyReport::~EnergyReport((EnergyReport *)local_180);
  InterpreterTestSuite::TestContext::~TestContext((TestContext *)local_140);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_EnergyReport)
{
    TestContext ctx;
    InitContext(ctx);

    EnergyReport rep;
    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetEnergyReport(_)).WillOnce(Return(&rep));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("energy report 1234::5678");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}